

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateRangeAffinityStr(Expr *pRight,int n,char *zAff)

{
  char cVar1;
  int iVar2;
  Expr *pExpr;
  Expr *p;
  int i;
  char *zAff_local;
  int n_local;
  Expr *pRight_local;
  
  p._4_4_ = 0;
  do {
    if (n <= p._4_4_) {
      return;
    }
    pExpr = sqlite3VectorFieldSubexpr(pRight,p._4_4_);
    cVar1 = sqlite3CompareAffinity(pExpr,zAff[p._4_4_]);
    if (cVar1 == 'A') {
LAB_00199459:
      zAff[p._4_4_] = 'A';
    }
    else {
      iVar2 = sqlite3ExprNeedsNoAffinityChange(pExpr,zAff[p._4_4_]);
      if (iVar2 != 0) goto LAB_00199459;
    }
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

static void updateRangeAffinityStr(
  Expr *pRight,                   /* RHS of comparison */
  int n,                          /* Number of vector elements in comparison */
  char *zAff                      /* Affinity string to modify */
){
  int i;
  for(i=0; i<n; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pRight, i);
    if( sqlite3CompareAffinity(p, zAff[i])==SQLITE_AFF_BLOB
     || sqlite3ExprNeedsNoAffinityChange(p, zAff[i])
    ){
      zAff[i] = SQLITE_AFF_BLOB;
    }
  }
}